

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

ModifiedRow * __thiscall
QMap<int,_QSqlTableModelPrivate::ModifiedRow>::operator[]
          (QMap<int,_QSqlTableModelPrivate::ModifiedRow> *this,int *key)

{
  bool bVar1;
  pointer ppVar2;
  map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>
  *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>,_bool>
  pVar3;
  iterator i;
  QMap<int,_QSqlTableModelPrivate::ModifiedRow> copy;
  map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>
  *in_stack_ffffffffffffff28;
  ModifiedRow *pMVar4;
  QMap<int,_QSqlTableModelPrivate::ModifiedRow> *in_stack_ffffffffffffff30;
  pair<const_int,_QSqlTableModelPrivate::ModifiedRow> *this_00;
  undefined1 local_80 [8];
  _Self local_78;
  _Self local_70;
  QSqlRecord local_68;
  ModifiedRow local_60 [2];
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.d.ptr =
       (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
       (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff30->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff30,
         (QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)in_stack_ffffffffffffff28);
  }
  else {
    memset(&local_68,0,8);
    QMap((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)0x171a63);
  }
  detach(in_stack_ffffffffffffff30);
  local_70._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
                *)0x171a83);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x171a94);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
                *)0x171aa3);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator==(&local_70,&local_78);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>_>
                  *)0x171ad6);
    this_00 = (pair<const_int,_QSqlTableModelPrivate::ModifiedRow> *)local_80;
    QSqlRecord::QSqlRecord((QSqlRecord *)this_00);
    QSqlTableModelPrivate::ModifiedRow::ModifiedRow
              (local_60,(Op)((ulong)in_RSI >> 0x20),(QSqlRecord *)this_00);
    std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>::
    pair<QSqlTableModelPrivate::ModifiedRow,_true>
              (this_00,(int *)in_stack_ffffffffffffff28,(ModifiedRow *)0x171b2a);
    pVar3 = std::
            map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>
            ::insert(in_RSI,this_00);
    local_70._M_node = (_Base_ptr)pVar3.first._M_node;
    local_10 = pVar3.second;
    local_18 = local_70._M_node;
    std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>::~pair
              ((pair<const_int,_QSqlTableModelPrivate::ModifiedRow> *)0x171b74);
    QSqlTableModelPrivate::ModifiedRow::~ModifiedRow((ModifiedRow *)this_00);
    QSqlRecord::~QSqlRecord((QSqlRecord *)0x171b88);
  }
  ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>::
           operator->((_Rb_tree_iterator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>
                       *)0x171b92);
  pMVar4 = &ppVar2->second;
  ~QMap((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)0x171ba4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pMVar4;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }